

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::Run(cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool noconfigure)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string message;
  string local_258;
  string local_238;
  byte abStack_218 [488];
  
  SetArgs(this,args,false);
  if (cmSystemTools::s_ErrorOccured != false) {
    return -1;
  }
  if (cmSystemTools::s_FatalErrorOccured != false) {
    return -1;
  }
  bVar1 = cmSystemTools::GetInterruptFlag();
  if (bVar1) {
    return -1;
  }
  if ((this->CheckStampList)._M_string_length != 0) {
    pcVar4 = (this->CheckStampList)._M_dataplus._M_p;
    bVar1 = cmsys::SystemTools::FileExists(pcVar4);
    if (bVar1) {
      std::ifstream::ifstream(&local_238,pcVar4,_S_in);
      if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        local_258._M_string_length = 0;
        local_258.field_2._M_local_buf[0] = '\0';
        do {
          bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&local_238,&local_258,(bool *)0x0,-1);
          if (!bVar1) break;
          bVar2 = cmakeCheckStampFile(local_258._M_dataplus._M_p);
        } while (bVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,
                          CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                   local_258.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(&local_238);
        if (!bVar1) {
          return 0;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"CMake is re-running because generate.stamp.list ",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"could not be read.\n",0x13);
        std::ifstream::~ifstream(&local_238);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"CMake is re-running because generate.stamp.list ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"is missing.\n",0xc);
    }
  }
  if (((this->CheckStampFile)._M_string_length == 0) ||
     (bVar1 = cmakeCheckStampFile((this->CheckStampFile)._M_dataplus._M_p), !bVar1)) {
    if (this->CurrentWorkingMode == NORMAL_MODE) {
      iVar3 = LoadCache(this);
      if (iVar3 < 0) {
        pcVar4 = "Error executing cmake::LoadCache(). Aborting.\n";
        goto LAB_00375093;
      }
    }
    else {
      AddCMakePaths(this);
    }
    bVar1 = SetCacheArgs(this,args);
    if (!bVar1) {
      pcVar4 = "Problem processing arguments. Aborting.\n";
LAB_00375093:
      cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
      return -1;
    }
    if (this->CurrentWorkingMode == NORMAL_MODE) {
      pcVar4 = getenv("MAKEFLAGS");
      if (pcVar4 != (char *)0x0) {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"MAKEFLAGS=","");
        cmsys::SystemTools::PutEnv(&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
      }
      PreLoadCMakeFiles(this);
      if (noconfigure) {
        return 0;
      }
      iVar3 = CheckBuildSystem(this);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = Configure(this);
      if (iVar3 == 0) {
        if (this->CurrentWorkingMode != NORMAL_MODE) {
          return 0;
        }
        iVar3 = Generate(this);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"Build files have been written to: ","");
        cmState::GetBinaryDirectory(this->State);
        std::__cxx11::string::append((char *)&local_238);
        UpdateProgress(this,local_238._M_dataplus._M_p,-1.0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          return iVar3;
        }
        return iVar3;
      }
      return iVar3;
    }
    if (cmSystemTools::s_ErrorOccured != false) {
      return -1;
    }
    if (cmSystemTools::s_FatalErrorOccured != false) {
      return -1;
    }
    bVar1 = cmSystemTools::GetInterruptFlag();
    if (bVar1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int cmake::Run(const std::vector<std::string>& args, bool noconfigure)
{
  // Process the arguments
  this->SetArgs(args);
  if(cmSystemTools::GetErrorOccuredFlag())
    {
    return -1;
    }

  // If we are given a stamp list file check if it is really out of date.
  if(!this->CheckStampList.empty() &&
     cmakeCheckStampList(this->CheckStampList.c_str()))
    {
    return 0;
    }

  // If we are given a stamp file check if it is really out of date.
  if(!this->CheckStampFile.empty() &&
     cmakeCheckStampFile(this->CheckStampFile.c_str()))
    {
    return 0;
    }

  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    // load the cache
    if(this->LoadCache() < 0)
      {
      cmSystemTools::Error("Error executing cmake::LoadCache(). Aborting.\n");
      return -1;
      }
    }
  else
    {
    this->AddCMakePaths();
    }

  // Add any cache args
  if ( !this->SetCacheArgs(args) )
    {
    cmSystemTools::Error("Problem processing arguments. Aborting.\n");
    return -1;
    }

  // In script mode we terminate after running the script.
  if(this->GetWorkingMode() != NORMAL_MODE)
    {
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      return -1;
      }
    else
      {
      return 0;
      }
    }

  // If MAKEFLAGS are given in the environment, remove the environment
  // variable.  This will prevent try-compile from succeeding when it
  // should fail (if "-i" is an option).  We cannot simply test
  // whether "-i" is given and remove it because some make programs
  // encode the MAKEFLAGS variable in a strange way.
  if(getenv("MAKEFLAGS"))
    {
    cmSystemTools::PutEnv("MAKEFLAGS=");
    }

  this->PreLoadCMakeFiles();

  if ( noconfigure )
    {
    return 0;
    }

  // now run the global generate
  // Check the state of the build system to see if we need to regenerate.
  if(!this->CheckBuildSystem())
    {
    return 0;
    }

  int ret = this->Configure();
  if (ret || this->GetWorkingMode() != NORMAL_MODE)
    {
#if defined(CMAKE_HAVE_VS_GENERATORS)
    if(!this->VSSolutionFile.empty() && this->GlobalGenerator)
      {
      // CMake is running to regenerate a Visual Studio build tree
      // during a build from the VS IDE.  The build files cannot be
      // regenerated, so we should stop the build.
      cmSystemTools::Message(
        "CMake Configure step failed.  "
        "Build files cannot be regenerated correctly.  "
        "Attempting to stop IDE build.");
      cmGlobalVisualStudioGenerator* gg =
        static_cast<cmGlobalVisualStudioGenerator*>(this->GlobalGenerator);
      gg->CallVisualStudioMacro(cmGlobalVisualStudioGenerator::MacroStop,
                                this->VSSolutionFile.c_str());
      }
#endif
    return ret;
    }
  ret = this->Generate();
  std::string message = "Build files have been written to: ";
  message += this->GetHomeOutputDirectory();
  this->UpdateProgress(message.c_str(), -1);
  return ret;
}